

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O2

int __thiscall
Centaurus::CATNMachine<wchar_t>::import_literal_terminal
          (CATNMachine<wchar_t> *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *literal,
          int origin,int tag)

{
  wchar_t start;
  size_type sVar1;
  pointer pwVar2;
  long lVar3;
  CharClass<wchar_t> local_50;
  
  sVar1 = literal->_M_string_length;
  pwVar2 = (literal->_M_dataplus)._M_p;
  for (lVar3 = 0; sVar1 << 2 != lVar3; lVar3 = lVar3 + 4) {
    start = *(wchar_t *)((long)pwVar2 + lVar3);
    CharClass<wchar_t>::CharClass(&local_50,start,start + L'\x01');
    origin = add_node(this,&local_50,origin,tag);
    CharClass<wchar_t>::~CharClass(&local_50);
    tag = 0;
  }
  return origin;
}

Assistant:

int import_literal_terminal(const std::basic_string<TCHAR>& literal, int origin, int tag)
    {
        for (TCHAR ch : literal)
        {
            origin = add_node(CharClass<TCHAR>(ch, ch + 1), origin, tag);
            tag = 0;
        }
        return origin;
    }